

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O2

BitStream * bsOpenReadStream(FILE *stream)

{
  int iVar1;
  BitStream *pBVar2;
  int *piVar3;
  BitStream *extraout_RAX;
  undefined4 extraout_var;
  BitStream *extraout_RAX_00;
  BitStream *extraout_RAX_01;
  uint uVar4;
  uint uVar5;
  uint in_ESI;
  FILE *__stream;
  FILE *pFVar6;
  undefined8 *puVar7;
  FILE *__stream_00;
  BitStream *bs;
  
  puVar7 = (undefined8 *)0x18;
  pBVar2 = (BitStream *)malloc(0x18);
  if (pBVar2 != (BitStream *)0x0) {
    pBVar2->handle = stream;
    pBVar2->buffer = 0;
    pBVar2->buffLive = 0;
    pBVar2->mode = 'r';
    return pBVar2;
  }
  mallocFail((Int32)puVar7);
  if (0 < *(int *)((long)puVar7 + 0xc)) {
    uVar4 = *(int *)((long)puVar7 + 0xc) - 1;
    *(uint *)((long)puVar7 + 0xc) = uVar4;
    return (BitStream *)(ulong)((*(uint *)(puVar7 + 1) >> (uVar4 & 0x1f) & 1) != 0);
  }
  pFVar6 = (FILE *)*puVar7;
  uVar4 = getc(pFVar6);
  if (uVar4 != 0xffffffff) {
    *(undefined4 *)((long)puVar7 + 0xc) = 7;
    *(uint *)(puVar7 + 1) = uVar4;
    return (BitStream *)(ulong)(uVar4 >> 7 & 1);
  }
  piVar3 = __errno_location();
  if (*piVar3 == 0) {
    return (BitStream *)0x2;
  }
  readError();
  if (*(char *)&pFVar6->_IO_read_end == 'w') {
    iVar1 = *(int *)((long)&pFVar6->_IO_read_ptr + 4);
    while (iVar1 < 8) {
      iVar1 = iVar1 + 1;
      *(int *)((long)&pFVar6->_IO_read_ptr + 4) = iVar1;
      *(int *)&pFVar6->_IO_read_ptr = *(int *)&pFVar6->_IO_read_ptr << 1;
    }
    __stream_00 = (FILE *)(ulong)*(byte *)&pFVar6->_IO_read_ptr;
    __stream = *(FILE **)pFVar6;
    iVar1 = putc((uint)*(byte *)&pFVar6->_IO_read_ptr,__stream);
    in_ESI = (uint)__stream;
    if (iVar1 != -1) {
      bytesOut = bytesOut + 1;
      __stream_00 = *(FILE **)pFVar6;
      iVar1 = fflush(__stream_00);
      if (iVar1 != -1) goto LAB_00101a07;
    }
  }
  else {
LAB_00101a07:
    __stream_00 = *(FILE **)pFVar6;
    iVar1 = fclose(__stream_00);
    if (iVar1 != -1) {
      free(pFVar6);
      return extraout_RAX;
    }
    if (*(char *)&pFVar6->_IO_read_end != 'w') goto LAB_00101a28;
  }
  writeError();
LAB_00101a28:
  readError();
  iVar1 = *(int *)((long)&__stream_00->_IO_read_ptr + 4);
  if (iVar1 == 8) {
    uVar4 = *(uint *)&__stream_00->_IO_read_ptr & 0xff;
    bs = (BitStream *)(ulong)uVar4;
    pFVar6 = *(FILE **)__stream_00;
    iVar1 = putc(uVar4,pFVar6);
    uVar4 = (uint)pFVar6;
    pBVar2 = (BitStream *)CONCAT44(extraout_var,iVar1);
    if (iVar1 == -1) {
      writeError();
      pBVar2 = extraout_RAX_00;
      for (uVar5 = 7; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
        bsPutBit(bs,(uint)((uVar4 >> (uVar5 & 0x1f) & 1) != 0));
        pBVar2 = extraout_RAX_01;
      }
      return pBVar2;
    }
    bytesOut = bytesOut + 1;
    *(undefined4 *)((long)&__stream_00->_IO_read_ptr + 4) = 1;
    *(uint *)&__stream_00->_IO_read_ptr = in_ESI & 1;
  }
  else {
    *(uint *)&__stream_00->_IO_read_ptr = (in_ESI & 1) + *(uint *)&__stream_00->_IO_read_ptr * 2;
    uVar4 = iVar1 + 1;
    pBVar2 = (BitStream *)(ulong)uVar4;
    *(uint *)((long)&__stream_00->_IO_read_ptr + 4) = uVar4;
  }
  return pBVar2;
}

Assistant:

static BitStream* bsOpenReadStream ( FILE* stream )
{
   BitStream *bs = malloc ( sizeof(BitStream) );
   if (bs == NULL) mallocFail ( sizeof(BitStream) );
   bs->handle = stream;
   bs->buffer = 0;
   bs->buffLive = 0;
   bs->mode = 'r';
   return bs;
}